

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotprecv.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"         -s <can_id>   (source can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -d <can_id>   (destination can_id. Use 8 digits for extended IDs)\n");
  fprintf(_stderr,"         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
  fprintf(_stderr,"         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
  fprintf(_stderr,"         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
  fprintf(_stderr,"         -b <bs>       (blocksize. 0 = off)\n");
  fprintf(_stderr,"         -m <val>      (STmin in ms/ns. See spec.)\n");
  fprintf(_stderr,"         -f <time ns>  (force rx stmin value in nanosecs)\n");
  fprintf(_stderr,"         -w <num>      (max. wait frame transmissions.)\n");
  fprintf(_stderr,"         -l            (loop: do not exit after pdu reception.)\n");
  fprintf(_stderr,"         -F            (enable dynamic flow control parameters)\n");
  fprintf(_stderr,"         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
  fprintf(_stderr,"\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
  fprintf(_stderr,"The pdu data is written on STDOUT in space separated ASCII hex values.\n");
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -s <can_id>   (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>   (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
	fprintf(stderr, "         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
	fprintf(stderr, "         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
	fprintf(stderr, "         -b <bs>       (blocksize. 0 = off)\n");
	fprintf(stderr, "         -m <val>      (STmin in ms/ns. See spec.)\n");
	fprintf(stderr, "         -f <time ns>  (force rx stmin value in nanosecs)\n");
	fprintf(stderr, "         -w <num>      (max. wait frame transmissions.)\n");
	fprintf(stderr, "         -l            (loop: do not exit after pdu reception.)\n");
	fprintf(stderr, "         -F            (enable dynamic flow control parameters)\n");
	fprintf(stderr, "         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
	fprintf(stderr, "\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
	fprintf(stderr, "The pdu data is written on STDOUT in space separated ASCII hex values.\n");
	fprintf(stderr, "\n");
}